

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O1

Token * __thiscall slang::syntax::SyntaxNode::getFirstTokenPtr(SyntaxNode *this)

{
  _Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> _Var1;
  variant_alternative_t<1UL,_variant<Token_*,_SyntaxNode_*>_> *ppSVar2;
  Token *pTVar3;
  variant_alternative_t<0UL,_variant<Token_*,_SyntaxNode_*>_> *ppTVar4;
  PtrGetChildVisitor *in_RCX;
  undefined1 extraout_DL;
  char extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 uVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 uVar6;
  unsigned_long *in_R8;
  _Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> _Var7;
  Token *unaff_R15;
  _Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> local_38 [2];
  
  _Var1 = (_Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>)getChildCount(this)
  ;
  if (_Var1 != (_Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>)0x0) {
    _Var7 = (_Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>)0x0;
    uVar5 = extraout_DL;
    uVar6 = extraout_var;
    do {
      local_38[0] = _Var7;
      local_38[0] = (_Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>)
                    detail::
                    visitSyntaxNode<slang::syntax::SyntaxNode,(anonymous_namespace)::PtrGetChildVisitor,unsigned_long&>
                              ((PtrTokenOrSyntax *)this,(detail *)&local_38[0]._M_first,
                               (SyntaxNode *)CONCAT71(uVar6,uVar5),in_RCX,in_R8);
      if (extraout_DL_00 == '\0') {
        ppTVar4 = std::get<0ul,slang::parsing::Token*,slang::syntax::SyntaxNode*>
                            ((variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> *)
                             &local_38[0]._M_first);
        uVar5 = extraout_DL_03;
        uVar6 = extraout_var_02;
        if (*ppTVar4 == (variant_alternative_t<0UL,_variant<Token_*,_SyntaxNode_*>_>)0x0)
        goto LAB_006b1f32;
        ppTVar4 = std::get<0ul,slang::parsing::Token*,slang::syntax::SyntaxNode*>
                            ((variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> *)
                             &local_38[0]._M_first);
        in_RCX = (PtrGetChildVisitor *)0x0;
        uVar5 = extraout_DL_04;
        uVar6 = extraout_var_03;
        unaff_R15 = *ppTVar4;
      }
      else {
        ppSVar2 = std::get<1ul,slang::parsing::Token*,slang::syntax::SyntaxNode*>
                            ((variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> *)
                             &local_38[0]._M_first);
        uVar5 = extraout_DL_01;
        uVar6 = extraout_var_00;
        if (*ppSVar2 == (variant_alternative_t<1UL,_variant<Token_*,_SyntaxNode_*>_>)0x0) {
LAB_006b1f32:
          in_RCX = (PtrGetChildVisitor *)CONCAT71((int7)((ulong)in_RCX >> 8),1);
        }
        else {
          ppSVar2 = std::get<1ul,slang::parsing::Token*,slang::syntax::SyntaxNode*>
                              ((variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> *)
                               &local_38[0]._M_first);
          pTVar3 = getFirstTokenPtr(*ppSVar2);
          in_RCX = (PtrGetChildVisitor *)CONCAT71((int7)((ulong)in_RCX >> 8),pTVar3 == (Token *)0x0)
          ;
          uVar5 = extraout_DL_02;
          uVar6 = extraout_var_01;
          if (pTVar3 != (Token *)0x0) {
            unaff_R15 = pTVar3;
          }
        }
      }
      if ((char)in_RCX == '\0') {
        return unaff_R15;
      }
      _Var7 = (_Variadic_union<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>)
              ((long)_Var7 + 1);
    } while (_Var1 != _Var7);
  }
  return (Token *)0x0;
}

Assistant:

parsing::Token* SyntaxNode::getFirstTokenPtr() {
    size_t childCount = getChildCount();
    for (size_t i = 0; i < childCount; i++) {
        auto child = getChildPtr(i);
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getFirstTokenPtr();
            if (result)
                return result;
        }
    }
    return nullptr;
}